

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_354d::UtilTest_ExecuteShellCommand_Test::TestBody
          (UtilTest_ExecuteShellCommand_Test *this)

{
  long lVar1;
  char *in_R9;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  string message;
  string local_40;
  AssertionResult gtest_ar_;
  
  ExecuteShellCommand((CStringRef)0x13147c,true);
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  ExecuteShellCommand((CStringRef)0x131481,true);
  lVar1 = std::__cxx11::string::find((char *)&message,0x131491);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = lVar1 != -1;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_70);
    std::operator<<((ostream *)(local_70.ptr_ + 0x10),(string *)&message);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"message.find(\"process exited with code \") != std::string::npos"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/util-test.cc",0x49,
               local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

TEST(UtilTest, ExecuteShellCommand) {
  ExecuteShellCommand("cd .");
  std::string message;
  try {
    ExecuteShellCommand("dir/bad-command");
  } catch (const mp::Error &e) {
    message = e.what();
  }
  EXPECT_TRUE(message.find("process exited with code ") != std::string::npos)
    << message;
}